

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O1

void __thiscall ipx::SparseMatrix::SortIndices(SparseMatrix *this)

{
  long lVar1;
  pointer piVar2;
  pointer pdVar3;
  bool bVar4;
  pointer piVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> work;
  allocator_type local_31;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_30;
  
  bVar4 = IsSorted(this);
  if (!bVar4) {
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
              (&local_30,(long)this->nrow_,&local_31);
    piVar5 = (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->colptr_).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar5) >> 2) + -1
       ) {
      lVar11 = 0;
      do {
        lVar7 = (long)piVar5[lVar11];
        uVar10 = 0;
        if (piVar5[lVar11] < piVar5[lVar11 + 1]) {
          pdVar9 = &(local_30.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second;
          piVar2 = (this->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3 = (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar10 = 0;
          do {
            ((pair<int,_double> *)(pdVar9 + -1))->first = piVar2[lVar7 + uVar10];
            *pdVar9 = pdVar3[lVar7 + uVar10];
            pdVar9 = pdVar9 + 2;
            lVar1 = lVar7 + uVar10;
            uVar10 = uVar10 + 1;
          } while (lVar1 + 1 < (long)piVar5[lVar11 + 1]);
        }
        if ((int)uVar10 != 0) {
          iVar8 = 0;
          if ((int)uVar10 != 1) {
            iVar8 = 0;
            uVar6 = uVar10 & 0xffffffff;
            do {
              iVar8 = iVar8 + 1;
              bVar4 = 3 < uVar6;
              uVar6 = uVar6 >> 1;
            } while (bVar4);
          }
          pdqsort_detail::
          pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,std::less<std::pair<int,double>>,false>
                    (local_30.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_30.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (uVar10 & 0xffffffff),iVar8,1);
        }
        piVar5 = (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar7 = (long)piVar5[lVar11];
        if (piVar5[lVar11] < piVar5[lVar11 + 1]) {
          piVar2 = (this->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3 = (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar9 = &(local_30.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second;
          do {
            piVar2[lVar7] = ((pair<int,_double> *)(pdVar9 + -1))->first;
            pdVar3[lVar7] = *pdVar9;
            lVar7 = lVar7 + 1;
            pdVar9 = pdVar9 + 2;
          } while (lVar7 < piVar5[lVar11 + 1]);
        }
        lVar11 = lVar11 + 1;
        piVar5 = (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (lVar11 < ((long)(this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish - (long)piVar5) * 0x40000000 +
                        -0x100000000 >> 0x20);
    }
    if (local_30.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void SparseMatrix::SortIndices() {
    if (IsSorted())
        return;
    std::vector<std::pair<Int,double>> work(rows());
    for (Int j = 0; j < cols(); j++) {
        Int nz = 0;             // # entries in column j
        for (Int p = begin(j); p < end(j); p++) {
            work[nz].first = index(p);
            work[nz].second = value(p);
            nz++;
        }
        pdqsort(work.begin(), work.begin() + nz);
        for (Int k = 0, p = begin(j); p < end(j); k++, p++) {
            index(p) = work[k].first;
            value(p) = work[k].second;
        }
    }
}